

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O1

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createInternalLoad
          (LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  PSNode *pPVar1;
  Instruction *pIVar2;
  PSNode *op1;
  PSNode *local_10;
  
  if ((*(uint *)(Inst + 0x14) >> 0x1e & 1) == 0) {
    pIVar2 = Inst + -(ulong)(*(uint *)(Inst + 0x14) << 5);
  }
  else {
    pIVar2 = *(Instruction **)(Inst + -8);
  }
  local_10 = getOperand(this,*(Value **)pIVar2);
  pPVar1 = PointerGraph::create<(dg::pta::PSNodeType)2,dg::pta::PSNode*&>
                     ((PointerGraph *)this,&local_10);
  return pPVar1;
}

Assistant:

PSNode *
LLVMPointerGraphBuilder::createInternalLoad(const llvm::Instruction *Inst) {
    const llvm::Value *op = Inst->getOperand(0);

    PSNode *op1 = getOperand(op);
    PSNode *node = PS.create<PSNodeType::LOAD>(op1);
    assert(node);

    return node;
}